

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::qr_solve
          (Epnp *this,Matrix<double,_6,_4,_0,_6,_4> *A_orig,Matrix<double,_6,_1,_0,_6,_1> *b,
          Matrix<double,_4,_1,_0,_4,_1> *X)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  Index IVar6;
  ulong uVar7;
  Scalar *pSVar8;
  ostream *this_00;
  Scalar *pSVar9;
  Scalar *pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int j_2;
  double sum_2;
  double *ppAij_1;
  int i_6;
  double *pX;
  int i_5;
  int i_4;
  double tau_1;
  double *ppAij;
  int j_1;
  double *pb;
  double *ppAjj;
  int i_3;
  double tau;
  int i_2;
  double sum_1;
  double *ppAik_2;
  int j;
  double sigma;
  int i_1;
  double inv_eta;
  double sum;
  double *ppAik_1;
  double elt;
  int i;
  double eta;
  double *ppAik;
  int k;
  double *ppAkk;
  double *pA;
  int nc;
  int nr;
  Matrix<double,_4,_6,_0,_4,_6> A;
  EigenBase<Eigen::Transpose<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>_> *in_stack_fffffffffffffd80;
  Matrix<double,_4,_6,_0,_4,_6> *in_stack_fffffffffffffd88;
  int local_234;
  double local_230;
  Scalar *local_228;
  int local_21c;
  int local_210;
  int local_20c;
  double local_208;
  Scalar *local_200;
  int local_1f4;
  Scalar *local_1e8;
  int local_1dc;
  int local_1cc;
  double local_1c8;
  double *local_1c0;
  int local_1b4;
  double local_1b0;
  int local_1a4;
  double local_198;
  double *local_190;
  int local_17c;
  double local_178;
  double *local_170;
  int local_164;
  double *local_160;
  
  Eigen::DenseBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,4,6,0,4,6>::Matrix<Eigen::Transpose<Eigen::Matrix<double,6,4,0,6,4>>>
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_> *)0x911b96);
  iVar4 = (int)IVar6;
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_> *)0x911baa);
  iVar5 = (int)IVar6;
  if ((qr_solve::max_nr != 0) && (qr_solve::max_nr < iVar4)) {
    if (qr_solve::A1 != (double *)0x0) {
      operator_delete__(qr_solve::A1);
    }
    if (qr_solve::A2 != (double *)0x0) {
      operator_delete__(qr_solve::A2);
    }
  }
  if (qr_solve::max_nr < iVar4) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar4;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    qr_solve::max_nr = iVar4;
    qr_solve::A1 = (double *)operator_new__(uVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)iVar4;
    uVar7 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    qr_solve::A2 = (double *)operator_new__(uVar7);
  }
  pSVar8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_6,_0,_4,_6>_>::data
                     ((PlainObjectBase<Eigen::Matrix<double,_4,_6,_0,_4,_6>_> *)0x911c8c);
  local_164 = 0;
  local_160 = pSVar8;
  while( true ) {
    if (iVar5 <= local_164) {
      pSVar9 = Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::data
                         ((PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)0x9121da);
      local_1e8 = pSVar8;
      for (local_1f4 = 0; local_1f4 < iVar5; local_1f4 = local_1f4 + 1) {
        local_200 = local_1e8;
        local_208 = 0.0;
        for (local_20c = local_1f4; local_20c < iVar4; local_20c = local_20c + 1) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *local_200;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = pSVar9[local_20c];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_208;
          auVar2 = vfmadd213sd_fma(auVar16,auVar24,auVar30);
          local_208 = auVar2._0_8_;
          local_200 = local_200 + iVar5;
        }
        dVar1 = qr_solve::A1[local_1f4];
        local_200 = local_1e8;
        for (local_210 = local_1f4; local_210 < iVar4; local_210 = local_210 + 1) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *local_200;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = pSVar9[local_210];
          auVar25._8_8_ = 0;
          auVar25._0_8_ = -(local_208 / dVar1);
          auVar2 = vfmadd213sd_fma(auVar17,auVar25,auVar31);
          pSVar9[local_210] = auVar2._0_8_;
          local_200 = local_200 + iVar5;
        }
        local_1e8 = local_1e8 + (iVar5 + 1);
      }
      pSVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::data
                          ((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x912396);
      pSVar10[iVar5 + -1] = pSVar9[iVar5 + -1] / qr_solve::A2[iVar5 + -1];
      for (local_21c = iVar5 + -2; -1 < local_21c; local_21c = local_21c + -1) {
        local_228 = pSVar8 + (long)(local_21c * iVar5) + (long)(local_21c + 1);
        local_230 = 0.0;
        local_234 = local_21c;
        while (local_234 = local_234 + 1, local_234 < iVar5) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *local_228;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = pSVar10[local_234];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_230;
          auVar2 = vfmadd213sd_fma(auVar18,auVar26,auVar32);
          local_230 = auVar2._0_8_;
          local_228 = local_228 + 1;
        }
        pSVar10[local_21c] = (pSVar9[local_21c] - local_230) / qr_solve::A2[local_21c];
      }
      return;
    }
    local_170 = local_160;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *local_160;
    auVar19._8_8_ = 0x7fffffffffffffff;
    auVar19._0_8_ = 0x7fffffffffffffff;
    auVar2 = vpand_avx(auVar11,auVar19);
    local_178 = auVar2._0_8_;
    local_17c = local_164;
    while (local_17c = local_17c + 1, local_17c < iVar4) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *local_170;
      auVar20._8_8_ = 0x7fffffffffffffff;
      auVar20._0_8_ = 0x7fffffffffffffff;
      auVar2 = vpand_avx(auVar12,auVar20);
      if (local_178 < auVar2._0_8_) {
        local_178 = auVar2._0_8_;
      }
      local_170 = local_170 + iVar5;
    }
    if ((local_178 == 0.0) && (!NAN(local_178))) break;
    local_190 = local_160;
    local_198 = 0.0;
    for (local_1a4 = local_164; local_1a4 < iVar4; local_1a4 = local_1a4 + 1) {
      *local_190 = (1.0 / local_178) * *local_190;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *local_190;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *local_190;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_198;
      auVar2 = vfmadd213sd_fma(auVar13,auVar21,auVar27);
      local_198 = auVar2._0_8_;
      local_190 = local_190 + iVar5;
    }
    local_1b0 = sqrt(local_198);
    if (*local_160 < 0.0) {
      local_1b0 = -local_1b0;
    }
    *local_160 = local_1b0 + *local_160;
    qr_solve::A1[local_164] = local_1b0 * *local_160;
    qr_solve::A2[local_164] = -local_178 * local_1b0;
    local_1b4 = local_164;
    while (local_1b4 = local_1b4 + 1, local_1b4 < iVar5) {
      local_1c0 = local_160;
      local_1c8 = 0.0;
      for (local_1cc = local_164; local_1cc < iVar4; local_1cc = local_1cc + 1) {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *local_1c0;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_1c0[local_1b4 - local_164];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_1c8;
        auVar2 = vfmadd213sd_fma(auVar14,auVar22,auVar28);
        local_1c8 = auVar2._0_8_;
        local_1c0 = local_1c0 + iVar5;
      }
      dVar1 = qr_solve::A1[local_164];
      local_1c0 = local_160;
      for (local_1dc = local_164; local_1dc < iVar4; local_1dc = local_1dc + 1) {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *local_1c0;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_1c0[local_1b4 - local_164];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = -(local_1c8 / dVar1);
        auVar2 = vfmadd213sd_fma(auVar15,auVar23,auVar29);
        local_1c0[local_1b4 - local_164] = auVar2._0_8_;
        local_1c0 = local_1c0 + iVar5;
      }
    }
    local_160 = local_160 + (iVar5 + 1);
    local_164 = local_164 + 1;
  }
  qr_solve::A2[local_164] = 0.0;
  qr_solve::A1[local_164] = 0.0;
  this_00 = std::operator<<((ostream *)&std::cerr,
                            "God damnit, A is singular, this shouldn\'t happen.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::qr_solve(
    Eigen::Matrix<double,6,4> & A_orig,
    Eigen::Matrix<double,6,1> & b,
    Eigen::Matrix<double,4,1> & X)
{
  Eigen::Matrix<double,4,6> A = A_orig.transpose();

  static int max_nr = 0;
  static double * A1, * A2;

  const int nr = A_orig.rows();
  const int nc = A_orig.cols();

  if (max_nr != 0 && max_nr < nr)
  {
    delete [] A1;
    delete [] A2;
  }
  if (max_nr < nr)
  {
    max_nr = nr;
    A1 = new double[nr];
    A2 = new double[nr];
  }

  double * pA = A.data(), * ppAkk = pA;
  for(int k = 0; k < nc; k++)
  {
    double * ppAik = ppAkk, eta = fabs(*ppAik);
    for(int i = k + 1; i < nr; i++)
    {
      double elt = fabs(*ppAik);
      if (eta < elt) eta = elt;
      ppAik += nc;
    }

    if (eta == 0)
    {
      A1[k] = A2[k] = 0.0;
      cerr << "God damnit, A is singular, this shouldn't happen." << endl;
      return;
    }
    else
    {
      double * ppAik = ppAkk, sum = 0.0, inv_eta = 1. / eta;
      for(int i = k; i < nr; i++)
      {
        *ppAik *= inv_eta;
        sum += *ppAik * *ppAik;
        ppAik += nc;
      }
      double sigma = sqrt(sum);
      if (*ppAkk < 0)
        sigma = -sigma;
      *ppAkk += sigma;
      A1[k] = sigma * *ppAkk;
      A2[k] = -eta * sigma;
      for(int j = k + 1; j < nc; j++)
      {
        double * ppAik = ppAkk, sum = 0;
        for(int i = k; i < nr; i++)
        {
          sum += *ppAik * ppAik[j - k];
          ppAik += nc;
        }
        double tau = sum / A1[k];
        ppAik = ppAkk;
        for(int i = k; i < nr; i++)
        {
          ppAik[j - k] -= tau * *ppAik;
          ppAik += nc;
        }
      }
    }
    ppAkk += nc + 1;
  }

  // b <- Qt b
  double * ppAjj = pA, * pb = b.data();
  for(int j = 0; j < nc; j++)
  {
    double * ppAij = ppAjj, tau = 0;
    for(int i = j; i < nr; i++)
    {
      tau += *ppAij * pb[i];
      ppAij += nc;
    }
    tau /= A1[j];
    ppAij = ppAjj;
    for(int i = j; i < nr; i++)
    {
      pb[i] -= tau * *ppAij;
      ppAij += nc;
    }
    ppAjj += nc + 1;
  }

  // X = R-1 b
  double * pX = X.data();
  pX[nc - 1] = pb[nc - 1] / A2[nc - 1];
  for(int i = nc - 2; i >= 0; i--)
  {
    double * ppAij = pA + i * nc + (i + 1), sum = 0;

    for(int j = i + 1; j < nc; j++)
    {
      sum += *ppAij * pX[j];
      ppAij++;
    }
    pX[i] = (pb[i] - sum) / A2[i];
  }
}